

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O1

void __thiscall Node::SmoothTypes(Node *this,Node *DefaultType)

{
  Node *pNVar1;
  pointer pcVar2;
  VARTYPE VVar3;
  int iVar4;
  Node *pNVar5;
  Node *this_00;
  _Alloc_hider _Var6;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pNVar1 = this->Tree[1];
  if (pNVar1 != (Node *)0x0) goto LAB_0010ac97;
  pNVar5 = this->Tree[0];
  if (DefaultType == (Node *)0x0) {
    this_00 = (Node *)operator_new(0x70);
    if (pNVar5 == (Node *)0x0) {
      iVar4 = UnguessVarType(VARTYPE_NONE);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
      Node(this_00,iVar4,&local_b0,0,0);
      this->Tree[1] = this_00;
      _Var6._M_p = local_b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_0010ac97;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar2 = (pNVar5->TextValue)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar2,pcVar2 + (pNVar5->TextValue)._M_string_length);
      VVar3 = GuessVarType(&local_d0);
      iVar4 = UnguessVarType(VVar3);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      Node(this_00,iVar4,&local_90,0,0);
      this->Tree[1] = this_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_b0.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
      _Var6._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0010ac97;
    }
  }
  else {
    pcVar2 = (pNVar5->TextValue)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (pNVar5->TextValue)._M_string_length);
    VVar3 = GuessVarType(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pNVar5 = (Node *)operator_new(0x70);
    if (VVar3 == VARTYPE_REAL) {
      Node(pNVar5,DefaultType);
      this->Tree[1] = pNVar5;
      goto LAB_0010ac97;
    }
    iVar4 = UnguessVarType(VVar3);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    Node(pNVar5,iVar4,&local_70,0,0);
    this->Tree[1] = pNVar5;
    local_b0.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    _Var6._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0010ac97;
  }
  operator_delete(_Var6._M_p,local_b0.field_2._M_allocated_capacity + 1);
LAB_0010ac97:
  if (this->Block[0] != (Node *)0x0) {
    if (pNVar1 != (Node *)0x0) {
      DefaultType = this->Tree[1];
    }
    SmoothTypes(this->Block[0],DefaultType);
  }
  return;
}

Assistant:

void Node::SmoothTypes(
	Node* DefaultType	/**< Node that defines the default types */
)
{
	bool actualtype = false;

	if (Tree[1] == 0)
	{
		//
		// Fake up a defintion for this segment since we dont have
		// on entered directly on this line.
		//
		if (DefaultType != 0)
		{
			VARTYPE rawtype = GuessVarType(Tree[0]->TextValue);
			if (rawtype == VARTYPE_REAL)
			{
				Tree[1] = new Node(*DefaultType);
			}
			else
			{
				Tree[1] = new Node(UnguessVarType(rawtype));
			}
		}
		else
		{
			if (Tree[0] != 0)
			{
				Tree[1] = new Node(UnguessVarType(
					GuessVarType(Tree[0]->TextValue)));
			}
			else
			{
				Tree[1] = new Node(UnguessVarType(VARTYPE_NONE));
			}
		}
	}
	else
	{
		//
		// We need to keep track of weither we have been given
		// an actual definition on this segment, or if we have
		// faked one up.
		//
		actualtype = true;
	}

	if (Block[0] != 0)
	{
		//
		// If we have an actual type here, use it, else use
		// what came from a previous segment
		//
		if (actualtype)
		{
			Block[0]->SmoothTypes(Tree[1]);
		}
		else
		{
			Block[0]->SmoothTypes(DefaultType);
		}
	}
}